

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_add_new_bitmap_flag(int flag)

{
  uint *puVar1;
  long *plVar2;
  
  plVar2 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar2 == 0) {
    *plVar2 = (long)(plVar2 + 1);
    initialize_tls_values((thread_local_state *)(plVar2 + 1));
  }
  if (*plVar2 != 0) {
    puVar1 = (uint *)(*plVar2 + 0x10c);
    *puVar1 = *puVar1 | flag;
  }
  return;
}

Assistant:

void al_add_new_bitmap_flag(int flag)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;
   tls->new_bitmap_flags |= flag;
}